

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  bool bVar4;
  undefined4 Reg_00;
  _Bool _Var5;
  uint uVar6;
  ARM_AM_ShiftOpc AVar7;
  ARM_AM_AddrOpc AVar8;
  uint uVar9;
  int64_t iVar10;
  uint64_t uVar11;
  MCOperand *pMVar12;
  MCOperand *pMVar13;
  MCOperand *op;
  char *pcVar14;
  MCOperand *pMVar15;
  MCRegisterClass *pMVar16;
  bool local_45d;
  undefined1 local_3c8 [8];
  MCInst NewMI;
  uint Reg;
  _Bool isStore;
  MCRegisterClass *MRC;
  uint i_1;
  uint BaseReg;
  _Bool Writeback;
  MCOperand *MO2_2;
  MCOperand *MO2_1;
  MCOperand *MO1_1;
  MCOperand *Dst_1;
  MCOperand *MO3;
  MCOperand *MO2;
  MCOperand *MO1;
  MCOperand *Dst;
  uint pubOpcode;
  uint i;
  uint tmp;
  uint Opcode;
  MCRegisterInfo *MRI;
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  uVar6 = MCInst_getOpcode(MI);
  if (uVar6 == 0x6f) goto LAB_00183b71;
  if (uVar6 == 0x7b) {
LAB_00184b63:
    pMVar16 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,1);
    local_45d = uVar6 == 0x1ad || uVar6 == 0x192;
    NewMI._815_1_ = local_45d;
    pMVar15 = MCInst_getOperand(MI,(uint)(uVar6 == 0x1ad || uVar6 == 0x192));
    NewMI._808_4_ = MCOperand_getReg(pMVar15);
    _Var5 = MCRegisterClass_contains(pMVar16,NewMI._808_4_);
    if (_Var5) {
      MCInst_Init((MCInst *)local_3c8);
      MCInst_setOpcode((MCInst *)local_3c8,uVar6);
      if ((NewMI._815_1_ & 1) != 0) {
        pMVar15 = MCInst_getOperand(MI,0);
        MCInst_addOperand2((MCInst *)local_3c8,pMVar15);
      }
      Reg_00 = NewMI._808_4_;
      pMVar16 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x12);
      uVar6 = MCRegisterInfo_getMatchingSuperReg((MCRegisterInfo *)Info,Reg_00,9,pMVar16);
      MCOperand_CreateReg0((MCInst *)local_3c8,uVar6);
      Dst._4_4_ = 2;
      if ((NewMI._815_1_ & 1) != 0) {
        Dst._4_4_ = 3;
      }
      for (; uVar6 = MCInst_getNumOperands(MI), Dst._4_4_ < uVar6; Dst._4_4_ = Dst._4_4_ + 1) {
        pMVar15 = MCInst_getOperand(MI,Dst._4_4_);
        MCInst_addOperand2((MCInst *)local_3c8,pMVar15);
      }
      printInstruction((MCInst *)local_3c8,O,(MCRegisterInfo *)Info);
      return;
    }
LAB_00184cec:
    printInstruction(MI,O,(MCRegisterInfo *)Info);
  }
  else {
    if (uVar6 == 0x94) {
LAB_0018465b:
      pMVar15 = MCInst_getOperand(MI,0);
      uVar9 = MCOperand_getReg(pMVar15);
      if ((uVar9 == 0xc) && (uVar9 = MCInst_getNumOperands(MI), 5 < uVar9)) {
        SStream_concat0(O,"pop");
        MCInst_setOpcodePub(MI,0x1a9);
        printPredicateOperand(MI,2,O);
        if (uVar6 == 0x941) {
          SStream_concat0(O,".w");
        }
        SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
        printRegisterList(MI,4,O);
        return;
      }
      goto LAB_00184cec;
    }
    if (uVar6 == 0xa5) goto LAB_00184b63;
    if (uVar6 != 0xbc) {
      if (uVar6 == 0xe2) {
        pMVar15 = MCInst_getOperand(MI,0);
        pMVar12 = MCInst_getOperand(MI,1);
        pMVar13 = MCInst_getOperand(MI,2);
        iVar10 = MCOperand_getImm(pMVar13);
        AVar7 = ARM_AM_getSORegShOp((uint)iVar10);
        pcVar14 = ARM_AM_getShiftOpcStr(AVar7);
        SStream_concat0(O,pcVar14);
        printSBitModifierOperand(MI,5,O);
        printPredicateOperand(MI,3,O);
        SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
        pcVar2 = MI->csh;
        uVar6 = MCOperand_getReg(pMVar15);
        printRegName(pcVar2,O,uVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(pMVar15);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
          pcVar3 = MI->flat_insn->detail;
          (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar2 = MI->csh;
        uVar6 = MCOperand_getReg(pMVar12);
        printRegName(pcVar2,O,uVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(pMVar12);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
          pcVar3 = MI->flat_insn->detail;
          (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
        }
        iVar10 = MCOperand_getImm(pMVar13);
        AVar7 = ARM_AM_getSORegShOp((uint)iVar10);
        if (AVar7 == ARM_AM_rrx) {
          return;
        }
        SStream_concat0(O,", ");
        iVar10 = MCOperand_getImm(pMVar13);
        uVar6 = getSORegOffset((uint)iVar10);
        uVar6 = translateShiftImm(uVar6);
        if (uVar6 < 10) {
          SStream_concat(O,"#%u",(ulong)uVar6);
        }
        else {
          SStream_concat(O,"#0x%x",(ulong)uVar6);
        }
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        iVar10 = MCOperand_getImm(pMVar13);
        AVar7 = ARM_AM_getSORegShOp((uint)iVar10);
        *(ARM_AM_ShiftOpc *)
         (MI->flat_insn->detail->groups +
         (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3a) = AVar7;
        *(uint *)(MI->flat_insn->detail->groups +
                 (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3e) =
             uVar6;
        return;
      }
      if (uVar6 == 0xe3) {
        pMVar15 = MCInst_getOperand(MI,0);
        pMVar12 = MCInst_getOperand(MI,1);
        pMVar13 = MCInst_getOperand(MI,2);
        op = MCInst_getOperand(MI,3);
        iVar10 = MCOperand_getImm(op);
        AVar7 = ARM_AM_getSORegShOp((uint)iVar10);
        pcVar14 = ARM_AM_getShiftOpcStr(AVar7);
        SStream_concat0(O,pcVar14);
        printSBitModifierOperand(MI,6,O);
        printPredicateOperand(MI,4,O);
        SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
        pcVar2 = MI->csh;
        uVar6 = MCOperand_getReg(pMVar15);
        printRegName(pcVar2,O,uVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(pMVar15);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
          pcVar3 = MI->flat_insn->detail;
          (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar2 = MI->csh;
        uVar6 = MCOperand_getReg(pMVar12);
        printRegName(pcVar2,O,uVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(pMVar12);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
          pcVar3 = MI->flat_insn->detail;
          (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
        }
        SStream_concat0(O,", ");
        pcVar2 = MI->csh;
        uVar6 = MCOperand_getReg(pMVar13);
        printRegName(pcVar2,O,uVar6);
        if (MI->csh->detail == CS_OPT_OFF) {
          return;
        }
        puVar1 = MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar13);
        *(uint *)(MI->flat_insn->detail->groups +
                 (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
        pcVar3 = MI->flat_insn->detail;
        (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
        return;
      }
      if (uVar6 == 0x192) goto LAB_00184b63;
      if (uVar6 == 0x198) {
LAB_0018441c:
        pMVar15 = MCInst_getOperand(MI,0);
        uVar9 = MCOperand_getReg(pMVar15);
        if ((uVar9 == 0xc) && (uVar9 = MCInst_getNumOperands(MI), 5 < uVar9)) {
          SStream_concat0(O,"push");
          MCInst_setOpcodePub(MI,0x1aa);
          printPredicateOperand(MI,2,O);
          if (uVar6 == 0xa24) {
            SStream_concat0(O,".w");
          }
          SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
          printRegisterList(MI,4,O);
          return;
        }
      }
      else {
        if (uVar6 == 0x1ad) goto LAB_00184b63;
        if (uVar6 == 0x1ba) {
          pMVar15 = MCInst_getOperand(MI,2);
          uVar6 = MCOperand_getReg(pMVar15);
          if (uVar6 == 0xc) {
            pMVar15 = MCInst_getOperand(MI,3);
            iVar10 = MCOperand_getImm(pMVar15);
            if (iVar10 == -4) {
              SStream_concat0(O,"push");
              MCInst_setOpcodePub(MI,0x1aa);
              printPredicateOperand(MI,4,O);
              SStream_concat0(O,"\t{");
              pcVar2 = MI->csh;
              pMVar15 = MCInst_getOperand(MI,1);
              uVar6 = MCOperand_getReg(pMVar15);
              printRegName(pcVar2,O,uVar6);
              if (MI->csh->detail != CS_OPT_OFF) {
                puVar1 = MI->flat_insn->detail->groups +
                         (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
                puVar1[0] = '\x01';
                puVar1[1] = '\0';
                puVar1[2] = '\0';
                puVar1[3] = '\0';
                pMVar15 = MCInst_getOperand(MI,1);
                uVar6 = MCOperand_getReg(pMVar15);
                *(uint *)(MI->flat_insn->detail->groups +
                         (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6
                ;
                pcVar3 = MI->flat_insn->detail;
                (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
              }
              SStream_concat0(O,"}");
              return;
            }
          }
        }
        else if ((uVar6 == 0x4e0) || (uVar6 == 0x4e4)) {
          pMVar15 = MCInst_getOperand(MI,0);
          uVar6 = MCOperand_getReg(pMVar15);
          if (uVar6 == 0xc) {
            SStream_concat0(O,"vpop");
            MCInst_setOpcodePub(MI,0x1b2);
            printPredicateOperand(MI,2,O);
            SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
            printRegisterList(MI,4,O);
            return;
          }
        }
        else {
          if ((uVar6 != 0x87c) && (uVar6 != 0x880)) {
            if (uVar6 != 0x921) {
              if (uVar6 == 0x941) goto LAB_0018465b;
              if (uVar6 == 0xa24) goto LAB_0018441c;
              if (uVar6 != 0xaa2) {
                if (uVar6 == 0xaa6) {
                  bVar4 = true;
                  pMVar15 = MCInst_getOperand(MI,0);
                  uVar6 = MCOperand_getReg(pMVar15);
                  for (MRC._4_4_ = 3; uVar9 = MCInst_getNumOperands(MI), MRC._4_4_ < uVar9;
                      MRC._4_4_ = MRC._4_4_ + 1) {
                    pMVar15 = MCInst_getOperand(MI,MRC._4_4_);
                    uVar9 = MCOperand_getReg(pMVar15);
                    if (uVar9 == uVar6) {
                      bVar4 = false;
                    }
                  }
                  SStream_concat0(O,"ldm");
                  MCInst_setOpcodePub(MI,0x39);
                  printPredicateOperand(MI,1,O);
                  SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
                  printRegName(MI->csh,O,uVar6);
                  if (MI->csh->detail != CS_OPT_OFF) {
                    puVar1 = MI->flat_insn->detail->groups +
                             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
                    puVar1[0] = '\x01';
                    puVar1[1] = '\0';
                    puVar1[2] = '\0';
                    puVar1[3] = '\0';
                    *(uint *)(MI->flat_insn->detail->groups +
                             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) =
                         uVar6;
                    pcVar3 = MI->flat_insn->detail;
                    (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
                  }
                  if (bVar4) {
                    MI->writeback = true;
                    SStream_concat0(O,"!");
                  }
                  SStream_concat0(O,", ");
                  printRegisterList(MI,3,O);
                  return;
                }
                goto LAB_00184cec;
              }
            }
LAB_00183b71:
            pMVar15 = MCInst_getOperand(MI,0);
            iVar10 = MCOperand_getImm(pMVar15);
            switch(iVar10) {
            case 0:
              SStream_concat0(O,"nop");
              Dst._0_4_ = 0x1ab;
              break;
            case 1:
              SStream_concat0(O,"yield");
              Dst._0_4_ = 0x1ac;
              break;
            case 2:
              SStream_concat0(O,"wfe");
              Dst._0_4_ = 0x1ad;
              break;
            case 3:
              SStream_concat0(O,"wfi");
              Dst._0_4_ = 0x1ae;
              break;
            case 4:
              SStream_concat0(O,"sev");
              Dst._0_4_ = 0x1af;
              break;
            case 5:
              uVar11 = ARM_getFeatureBits(MI->csh->mode);
              if ((uVar11 & 0x80000000000) == 0) goto switchD_00183bad_default;
              SStream_concat0(O,"sevl");
              Dst._0_4_ = 0x1b0;
              break;
            default:
switchD_00183bad_default:
              printInstruction(MI,O,(MCRegisterInfo *)Info);
              return;
            }
            printPredicateOperand(MI,1,O);
            if (uVar6 == 0x921) {
              SStream_concat0(O,".w");
            }
            MCInst_setOpcodePub(MI,(uint)Dst);
            return;
          }
          pMVar15 = MCInst_getOperand(MI,0);
          uVar6 = MCOperand_getReg(pMVar15);
          if (uVar6 == 0xc) {
            SStream_concat0(O,"vpush");
            MCInst_setOpcodePub(MI,0x1b1);
            printPredicateOperand(MI,2,O);
            SStream_concat0(O,anon_var_dwarf_43286 + 0x11);
            printRegisterList(MI,4,O);
            return;
          }
        }
      }
      goto LAB_00184cec;
    }
    pMVar15 = MCInst_getOperand(MI,2);
    uVar6 = MCOperand_getReg(pMVar15);
    if (uVar6 != 0xc) goto LAB_00184cec;
    pMVar15 = MCInst_getOperand(MI,4);
    iVar10 = MCOperand_getImm(pMVar15);
    AVar8 = getAM2Op((uint)iVar10);
    if (AVar8 == ARM_AM_add) {
      iVar10 = MCOperand_getImm(pMVar15);
      uVar6 = getAM2Offset((uint)iVar10);
      if (uVar6 != 4) goto LAB_00184751;
    }
    else {
LAB_00184751:
      iVar10 = MCOperand_getImm(pMVar15);
      if (iVar10 != 4) goto LAB_00184cec;
    }
    SStream_concat0(O,"pop");
    MCInst_setOpcodePub(MI,0x1a9);
    printPredicateOperand(MI,5,O);
    SStream_concat0(O,"\t{");
    pcVar2 = MI->csh;
    pMVar15 = MCInst_getOperand(MI,0);
    uVar6 = MCOperand_getReg(pMVar15);
    printRegName(pcVar2,O,uVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pMVar15 = MCInst_getOperand(MI,0);
      uVar6 = MCOperand_getReg(pMVar15);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar6;
      pcVar3 = MI->flat_insn->detail;
      (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
    }
    SStream_concat0(O,"}");
  }
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;

	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;

	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							SStream_concat0(O, ARM_AM_getShiftOpcStr(ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3))));
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							SStream_concat0(O, ARM_AM_getShiftOpcStr(ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2))));
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.op_count++;
							}

							if (ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							if (tmp > HEX_THRESHOLD)
								SStream_concat(O, "#0x%x", tmp);
							else
								SStream_concat(O, "#%u", tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.op_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;

				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));
				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
		 }
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}